

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shm_queue.h
# Opt level: O0

int __thiscall myutils::ShmemQueue::poll(ShmemQueue *this,pollfd *__fds,nfds_t __nfds,int __timeout)

{
  bool bVar1;
  memory_order mVar2;
  int iVar3;
  __int_type _Var4;
  ostream *poVar5;
  ulong uVar6;
  undefined7 extraout_var;
  int local_bc;
  duration<long,_std::ratio<1L,_1000L>_> local_b8;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_b0;
  duration<long,_std::ratio<1L,_1000000000L>_> local_a8;
  int local_9c;
  char *pcStack_98;
  int32_t pkt_size_1;
  char *p_1;
  char *pcStack_88;
  int32_t pkt_size;
  char *p;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  tStack_78;
  int32_t v;
  time_point begin_time;
  bool ret;
  size_t *size_local;
  char **data_local;
  ShmemQueue *this_local;
  
  begin_time.__d.__r._7_1_ = 0;
  tStack_78.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  while( true ) {
    p._4_4_ = 0;
    mVar2 = std::__cmpexch_failure_order(memory_order_seq_cst);
    switch(0x224b3a) {
    default:
      if (mVar2 - memory_order_consume < 2) {
        LOCK();
        iVar3 = (this->m_rw_mtx).super___atomic_base<int>._M_i;
        bVar1 = p._4_4_ == iVar3;
        if (bVar1) {
          (this->m_rw_mtx).super___atomic_base<int>._M_i = 1;
          iVar3 = p._4_4_;
        }
        UNLOCK();
        if (!bVar1) {
          p._4_4_ = iVar3;
        }
      }
      else if (mVar2 == memory_order_seq_cst) {
        LOCK();
        iVar3 = (this->m_rw_mtx).super___atomic_base<int>._M_i;
        bVar1 = p._4_4_ == iVar3;
        if (bVar1) {
          (this->m_rw_mtx).super___atomic_base<int>._M_i = 1;
          iVar3 = p._4_4_;
        }
        UNLOCK();
        if (!bVar1) {
          p._4_4_ = iVar3;
        }
      }
      else {
        LOCK();
        iVar3 = (this->m_rw_mtx).super___atomic_base<int>._M_i;
        bVar1 = p._4_4_ == iVar3;
        if (bVar1) {
          (this->m_rw_mtx).super___atomic_base<int>._M_i = 1;
          iVar3 = p._4_4_;
        }
        UNLOCK();
        if (!bVar1) {
          p._4_4_ = iVar3;
        }
      }
      break;
    case 2:
      if (mVar2 - memory_order_consume < 2) {
        LOCK();
        iVar3 = (this->m_rw_mtx).super___atomic_base<int>._M_i;
        bVar1 = p._4_4_ == iVar3;
        if (bVar1) {
          (this->m_rw_mtx).super___atomic_base<int>._M_i = 1;
          iVar3 = p._4_4_;
        }
        UNLOCK();
        if (!bVar1) {
          p._4_4_ = iVar3;
        }
      }
      else if (mVar2 == memory_order_seq_cst) {
        LOCK();
        iVar3 = (this->m_rw_mtx).super___atomic_base<int>._M_i;
        bVar1 = p._4_4_ == iVar3;
        if (bVar1) {
          (this->m_rw_mtx).super___atomic_base<int>._M_i = 1;
          iVar3 = p._4_4_;
        }
        UNLOCK();
        if (!bVar1) {
          p._4_4_ = iVar3;
        }
      }
      else {
        LOCK();
        iVar3 = (this->m_rw_mtx).super___atomic_base<int>._M_i;
        bVar1 = p._4_4_ == iVar3;
        if (bVar1) {
          (this->m_rw_mtx).super___atomic_base<int>._M_i = 1;
          iVar3 = p._4_4_;
        }
        UNLOCK();
        if (!bVar1) {
          p._4_4_ = iVar3;
        }
      }
      break;
    case 3:
      if (mVar2 - memory_order_consume < 2) {
        LOCK();
        iVar3 = (this->m_rw_mtx).super___atomic_base<int>._M_i;
        bVar1 = p._4_4_ == iVar3;
        if (bVar1) {
          (this->m_rw_mtx).super___atomic_base<int>._M_i = 1;
          iVar3 = p._4_4_;
        }
        UNLOCK();
        if (!bVar1) {
          p._4_4_ = iVar3;
        }
      }
      else if (mVar2 == memory_order_seq_cst) {
        LOCK();
        iVar3 = (this->m_rw_mtx).super___atomic_base<int>._M_i;
        bVar1 = p._4_4_ == iVar3;
        if (bVar1) {
          (this->m_rw_mtx).super___atomic_base<int>._M_i = 1;
          iVar3 = p._4_4_;
        }
        UNLOCK();
        if (!bVar1) {
          p._4_4_ = iVar3;
        }
      }
      else {
        LOCK();
        iVar3 = (this->m_rw_mtx).super___atomic_base<int>._M_i;
        bVar1 = p._4_4_ == iVar3;
        if (bVar1) {
          (this->m_rw_mtx).super___atomic_base<int>._M_i = 1;
          iVar3 = p._4_4_;
        }
        UNLOCK();
        if (!bVar1) {
          p._4_4_ = iVar3;
        }
      }
      break;
    case 4:
      if (mVar2 - memory_order_consume < 2) {
        LOCK();
        iVar3 = (this->m_rw_mtx).super___atomic_base<int>._M_i;
        bVar1 = p._4_4_ == iVar3;
        if (bVar1) {
          (this->m_rw_mtx).super___atomic_base<int>._M_i = 1;
          iVar3 = p._4_4_;
        }
        UNLOCK();
        if (!bVar1) {
          p._4_4_ = iVar3;
        }
      }
      else if (mVar2 == memory_order_seq_cst) {
        LOCK();
        iVar3 = (this->m_rw_mtx).super___atomic_base<int>._M_i;
        bVar1 = p._4_4_ == iVar3;
        if (bVar1) {
          (this->m_rw_mtx).super___atomic_base<int>._M_i = 1;
          iVar3 = p._4_4_;
        }
        UNLOCK();
        if (!bVar1) {
          p._4_4_ = iVar3;
        }
      }
      else {
        LOCK();
        iVar3 = (this->m_rw_mtx).super___atomic_base<int>._M_i;
        bVar1 = p._4_4_ == iVar3;
        if (bVar1) {
          (this->m_rw_mtx).super___atomic_base<int>._M_i = 1;
          iVar3 = p._4_4_;
        }
        UNLOCK();
        if (!bVar1) {
          p._4_4_ = iVar3;
        }
      }
    }
    if (bVar1) break;
    local_b0.__d.__r = (duration)std::chrono::_V2::system_clock::now();
    local_a8.__r = (rep)std::chrono::operator-(&local_b0,&stack0xffffffffffffff88);
    local_bc = 10;
    std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
              ((duration<long,std::ratio<1l,1000l>> *)&local_b8,&local_bc);
    bVar1 = std::chrono::operator<(&local_a8,&local_b8);
    uVar6 = CONCAT71(extraout_var,bVar1);
    if (!bVar1) {
      this_local._7_1_ = 0;
LAB_0022523e:
      return (int)CONCAT71((int7)(uVar6 >> 8),this_local._7_1_);
    }
  }
  if (this->m_read_pos < this->m_write_pos) {
    pcStack_88 = this->m_data + this->m_read_pos;
    p_1._4_4_ = *(int *)pcStack_88;
    *__fds = (pollfd)((long)pcStack_88 + 4);
    *(long *)__nfds = (long)p_1._4_4_;
    if (this->m_write_pos - this->m_read_pos < p_1._4_4_ + 4) {
      poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,p_1._4_4_);
      poVar5 = std::operator<<(poVar5,",");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,this->m_write_pos);
      poVar5 = std::operator<<(poVar5,",");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,this->m_read_pos);
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/xutiezhu[P]tqapi/lib/myutils/shm_queue.h"
                    ,0x69,"bool myutils::ShmemQueue::poll(const char **, size_t *)");
    }
    begin_time.__d.__r._7_1_ = 1;
  }
  else if (this->m_write_pos < this->m_read_pos) {
    pcStack_98 = this->m_data + this->m_read_pos;
    local_9c = *(int *)pcStack_98;
    *__fds = (pollfd)((long)pcStack_98 + 4);
    *(long *)__nfds = (long)local_9c;
    if (this->m_data_size - this->m_read_pos < local_9c + 4) {
      poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,*(ulong *)__nfds);
      poVar5 = std::operator<<(poVar5,",");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,this->m_data_realsize);
      poVar5 = std::operator<<(poVar5,",");
      std::ostream::operator<<(poVar5,this->m_read_pos);
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/xutiezhu[P]tqapi/lib/myutils/shm_queue.h"
                    ,0x75,"bool myutils::ShmemQueue::poll(const char **, size_t *)");
    }
    begin_time.__d.__r._7_1_ = 1;
  }
  _Var4 = std::__atomic_base<int>::operator--((__atomic_base<int> *)this,0);
  uVar6 = (ulong)CONCAT31((int3)((uint)_Var4 >> 8),begin_time.__d.__r._7_1_) & 0xffffffffffffff01;
  this_local._7_1_ = (undefined1)uVar6;
  goto LAB_0022523e;
}

Assistant:

bool ShmemQueue::poll(const char** data, size_t* size)
    {
        bool ret = false;
        auto begin_time = system_clock::now();
        do {
            int32_t v = 0;
            if (m_rw_mtx.compare_exchange_strong(v, 1)) {
                if (m_read_pos < m_write_pos) {
                    char* p = m_data + m_read_pos;
                    int32_t pkt_size = *(int32_t*)p;
                    *data = p + 4;
                    *size = pkt_size;
                    //assert(pkt_size + 4 <= m_write_pos - m_read_pos);
                    if (pkt_size + 4 > m_write_pos - m_read_pos) {
                        cout << pkt_size << "," << m_write_pos << "," << m_read_pos << endl;
                        assert(0);
                    }
                    ret = true;
                }
                else if (m_read_pos > m_write_pos) {
                    char* p = m_data + m_read_pos;
                    int32_t pkt_size = *(int32_t*)p;
                    *data = p + 4;
                    *size = pkt_size;
                    //assert( pkt_size + 4 <= m_data_size - m_read_pos);
                    if ( pkt_size + 4 > m_data_size - m_read_pos) {
                        cout << *size << "," << m_data_realsize << "," << m_read_pos;
                        assert(false);
                    }
                    ret = true;
                }
                m_rw_mtx--;
                return ret;
            }

        } while (system_clock::now() - begin_time < milliseconds(10));

        return false;
    }